

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O2

int __thiscall re2::RE2::Options::ParseFlags(Options *this)

{
  uint uVar1;
  ostream *this_00;
  uint uVar2;
  LogMessage local_190;
  
  uVar1 = 4;
  if (this->encoding_ != EncodingUTF8) {
    if (this->encoding_ == EncodingLatin1) {
      uVar1 = 0x24;
    }
    else if (this->log_errors_ == true) {
      LogMessage::LogMessage
                (&local_190,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",0x79,
                 2);
      this_00 = std::operator<<((ostream *)&local_190.str_,"Unknown encoding ");
      std::ostream::operator<<(this_00,this->encoding_);
      LogMessage::~LogMessage(&local_190);
    }
  }
  uVar2 = uVar1 | 0x794;
  if (this->posix_syntax_ != false) {
    uVar2 = uVar1;
  }
  uVar1 = uVar2 | 2;
  if (this->literal_ == false) {
    uVar1 = uVar2;
  }
  uVar2 = uVar1 + 0x800;
  if (this->never_nl_ == false) {
    uVar2 = uVar1;
  }
  uVar1 = uVar2 | 8;
  if (this->dot_nl_ == false) {
    uVar1 = uVar2;
  }
  uVar2 = uVar1 | 0x1000;
  if (this->never_capture_ == false) {
    uVar2 = uVar1;
  }
  uVar2 = this->case_sensitive_ ^ 1 | uVar2;
  uVar1 = uVar2 | 0x80;
  if (this->perl_classes_ == false) {
    uVar1 = uVar2;
  }
  uVar2 = uVar1 | 0x100;
  if (this->word_boundary_ == false) {
    uVar2 = uVar1;
  }
  uVar1 = uVar2 | 0x10;
  if (this->one_line_ == false) {
    uVar1 = uVar2;
  }
  return uVar1;
}

Assistant:

int RE2::Options::ParseFlags() const {
  int flags = Regexp::ClassNL;
  switch (encoding()) {
    default:
      if (log_errors())
        LOG(ERROR) << "Unknown encoding " << encoding();
      break;
    case RE2::Options::EncodingUTF8:
      break;
    case RE2::Options::EncodingLatin1:
      flags |= Regexp::Latin1;
      break;
  }

  if (!posix_syntax())
    flags |= Regexp::LikePerl;

  if (literal())
    flags |= Regexp::Literal;

  if (never_nl())
    flags |= Regexp::NeverNL;

  if (dot_nl())
    flags |= Regexp::DotNL;

  if (never_capture())
    flags |= Regexp::NeverCapture;

  if (!case_sensitive())
    flags |= Regexp::FoldCase;

  if (perl_classes())
    flags |= Regexp::PerlClasses;

  if (word_boundary())
    flags |= Regexp::PerlB;

  if (one_line())
    flags |= Regexp::OneLine;

  return flags;
}